

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O3

void __thiscall tcu::x11::egl::WindowFactory::WindowFactory(WindowFactory *this)

{
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"window","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"X11 Window","");
  eglu::NativeWindowFactory::NativeWindowFactory
            (&this->super_NativeWindowFactory,&local_38,&local_58,
             CAPABILITY_GET_SCREEN_SIZE|CAPABILITY_SET_SURFACE_SIZE|CAPABILITY_GET_SURFACE_SIZE|
             CAPABILITY_CREATE_SURFACE_PLATFORM|CAPABILITY_CREATE_SURFACE_LEGACY);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_NativeWindowFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__NativeWindowFactory_00cf2ab8;
  return;
}

Assistant:

WindowFactory::WindowFactory (void)
	: NativeWindowFactory ("window", "X11 Window", Window::CAPABILITIES)
{
}